

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_impl.h
# Opt level: O0

void __thiscall
node::Node<label::JSONLabel>::Node(Node<label::JSONLabel> *this,ConstReference label)

{
  ConstReference label_local;
  Node<label::JSONLabel> *this_local;
  
  std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::vector
            (&this->children_);
  ::label::JSONLabel::JSONLabel(&this->label_,label);
  return;
}

Assistant:

Node<Label>::Node(ConstReference label) : label_(label) {}